

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

void report_error(gvisitor_t *self,error_type_t error_type,gnode_t *node,char *format,...)

{
  undefined8 *puVar1;
  char in_AL;
  ulong uVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  undefined8 in_R8;
  ulong uVar6;
  undefined8 in_R9;
  code *pcVar7;
  undefined8 uVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char buffer [1024];
  undefined8 local_4f8;
  void **local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [32];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char local_428 [1032];
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  if ((node == (gnode_t *)0x0) || ((node->token).lineno != *(uint32_t *)((long)self->data + 0x20)))
  {
    if (error_type != GRAVITY_WARNING) {
      self->nerr = self->nerr + 1;
      if (node == (gnode_t *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (node->token).lineno;
      }
      *(uint32_t *)((long)self->data + 0x20) = uVar4;
    }
    puVar1 = (undefined8 *)self->delegate;
    if (puVar1 == (undefined8 *)0x0) {
      uVar8 = 0;
      pcVar7 = (code *)0x0;
    }
    else {
      uVar8 = *puVar1;
      pcVar7 = (code *)puVar1[4];
    }
    local_4b8 = in_R8;
    local_4b0 = in_R9;
    if (format != (char *)0x0) {
      local_4e8 = local_4d8;
      local_4f0 = &arg[0].overflow_arg_area;
      local_4f8 = 0x3000000020;
      vsnprintf(local_428,0x400,format,&local_4f8);
    }
    if (node == (gnode_t *)0x0) {
      uVar2 = 0;
      uVar3 = 0;
      uVar5 = 0;
      uVar6 = 0;
    }
    else {
      uVar2 = (ulong)(node->token).lineno;
      uVar3 = (ulong)(node->token).colno << 0x20;
      uVar5 = (ulong)(node->token).fileid;
      uVar6 = (ulong)(node->token).position << 0x20;
    }
    if (pcVar7 == (code *)0x0) {
      puts(local_428);
    }
    else {
      (*pcVar7)(0,error_type,local_428,uVar3 | uVar2,uVar6 | uVar5,uVar8);
    }
  }
  return;
}

Assistant:

static void report_error (gravity_parser_t *parser, error_type_t error_type, gtoken_s token, const char *format, ...) {
    // just one error for each line
    if (parser->last_error_lineno == token.lineno) return;

    // increment internal error counter (and save last reported line) only if it was a real error
    if (error_type != GRAVITY_WARNING) {
        parser->last_error_lineno = token.lineno;
        ++parser->nerrors;
    }

    // get error callback (if any)
    void *data = (parser->delegate) ? parser->delegate->xdata : NULL;
    gravity_error_callback error_fn = (parser->delegate) ? ((gravity_delegate_t *)parser->delegate)->error_callback : NULL;

    // build error message
    char buffer[1024];
    va_list arg;
    if (format) {
        va_start (arg, format);
        vsnprintf(buffer, sizeof(buffer), format, arg);
        va_end (arg);
    }

    // setup error struct
    error_desc_t error_desc = {
        .lineno = token.lineno,
        .colno = token.colno,
        .fileid = token.fileid,
        .offset = token.position
    };

    // finally call error callback
    if (error_fn) error_fn(NULL, error_type, buffer, error_desc, data);
    else printf("%s\n", buffer);
}